

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void luaX_init(lua_State *L)

{
  TString *pTVar1;
  TString *ts;
  TString *e;
  int i;
  lua_State *L_local;
  
  pTVar1 = luaS_newlstr(L,"_ENV",4);
  luaC_fix(L,(GCObject *)pTVar1);
  for (e._4_4_ = 0; e._4_4_ < 0x16; e._4_4_ = e._4_4_ + 1) {
    pTVar1 = luaS_new(L,luaX_tokens[e._4_4_]);
    luaC_fix(L,(GCObject *)pTVar1);
    pTVar1->extra = (char)e._4_4_ + '\x01';
  }
  return;
}

Assistant:

void luaX_init(lua_State *L) {
    int i;
    TString *e = luaS_newliteral(L, LUA_ENV);  /* create env name */
    luaC_fix(L, obj2gco(e));  /* never collect this name */
    for (i = 0; i < NUM_RESERVED; i++) {
        TString *ts = luaS_new(L, luaX_tokens[i]);
        luaC_fix(L, obj2gco(ts));  /* reserved words are never collected */
        ts->extra = cast_byte(i + 1);  /* reserved word */
    }
}